

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateLoadStackR0(IMC_Generator *this,shared_ptr<nigel::IM_Operator> *op)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  element_type *peVar3;
  shared_ptr<nigel::IM_Operator> local_110;
  shared_ptr<nigel::IM_Operator> local_100;
  shared_ptr<nigel::IM_Operator> local_f0;
  shared_ptr<nigel::IM_Operator> local_e0;
  shared_ptr<nigel::IM_Operator> local_d0;
  shared_ptr<nigel::IM_Operator> local_c0;
  shared_ptr<nigel::IM_Operator> local_b0;
  shared_ptr<nigel::IM_Operator> local_a0;
  shared_ptr<nigel::IM_Operator> local_90;
  shared_ptr<nigel::IM_Operator> local_80;
  undefined1 local_70 [24];
  size_t i;
  shared_ptr<nigel::IM_Operator> local_48;
  shared_ptr<nigel::IM_SFR> local_38;
  shared_ptr<nigel::IM_Operator> local_28;
  shared_ptr<nigel::IM_Operator> *local_18;
  shared_ptr<nigel::IM_Operator> *op_local;
  IMC_Generator *this_local;
  
  local_18 = op;
  op_local = (shared_ptr<nigel::IM_Operator> *)this;
  IM_SFR::getSFR((SFR)&local_38);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_28,&local_38);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_48,(nullptr_t)0x0);
  addCmd(this,mov_a_adr,&local_28,&local_48);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_48);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_28);
  std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_38);
  local_70._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    uVar2 = local_70._16_8_;
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               op);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_70);
    peVar3 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_70);
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3->scopeOffset;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_70);
    if (p_Var1 <= (ulong)uVar2) break;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_80,(nullptr_t)0x0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_90,(nullptr_t)0x0);
    addCmd(this,xch_a_r0,&local_80,&local_90);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_90);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_80);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a0,(nullptr_t)0x0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b0,(nullptr_t)0x0);
    addCmd(this,mov_a_atr0,&local_a0,&local_b0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a0);
    local_70._16_8_ = (long)(_func_int ***)local_70._16_8_ + 1;
  }
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_c0,op);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_d0,(nullptr_t)0x0);
  addCmd(this,add_a_const,&local_c0,&local_d0);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_d0);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_c0);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_e0,(nullptr_t)0x0);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f0,(nullptr_t)0x0);
  addCmd(this,clr_c,&local_e0,&local_f0);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f0);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_e0);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_100,(nullptr_t)0x0);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_110,(nullptr_t)0x0);
  addCmd(this,mov_r0_a,&local_100,&local_110);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_110);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_100);
  return;
}

Assistant:

void IMC_Generator::generateLoadStackR0( std::shared_ptr<IM_Operator> op )
	{
		addCmd( HexOp::mov_a_adr, IM_SFR::getSFR( IM_SFR::SFR::BR ) );
		for( size_t i = 0 ; i < op->as<IM_Variable>()->scopeOffset ; i++ )
		{//Resolve scope offset
			addCmd( HexOp::xch_a_r0 );
			addCmd( HexOp::mov_a_atr0 );
		}
		addCmd( HexOp::add_a_const, op );
		addCmd( HexOp::clr_c );//Clear carry because some operations require cleared carry.
		addCmd( HexOp::mov_r0_a );
	}